

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeStack.h
# Opt level: O2

LargeStackBlock<Js::StringCopyInfo> *
LargeStackBlock<Js::StringCopyInfo>::Make(ArenaAllocator *alloc,int itemCount)

{
  LargeStackBlock<Js::StringCopyInfo> *pLVar1;
  StringCopyInfo *pSVar2;
  
  pLVar1 = (LargeStackBlock<Js::StringCopyInfo> *)new<Memory::ArenaAllocator>(0x10,alloc,0x35916e);
  pLVar1->itemCount = itemCount;
  pSVar2 = Memory::AllocateArray<Memory::ArenaAllocator,Js::StringCopyInfo,false>
                     ((Memory *)alloc,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (long)itemCount);
  pLVar1->items = pSVar2;
  pLVar1->index = 0;
  return pLVar1;
}

Assistant:

static LargeStackBlock<T>* Make(ArenaAllocator* alloc,int itemCount) {
        LargeStackBlock<T>* block = AnewStruct(alloc, LargeStackBlock<T>);
        block->itemCount=itemCount;
        block->items = AnewArray(alloc, T, itemCount);
        block->index=0;
        return block;
    }